

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.h
# Opt level: O1

char * cmTargetPropertyComputer::GetProperty<cmGeneratorTarget>
                 (cmGeneratorTarget *tgt,string *prop,cmMessenger *messenger,
                 cmListFileBacktrace *context)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  
  pcVar3 = GetLocation<cmGeneratorTarget>(tgt,prop,messenger,context);
  if (pcVar3 == (char *)0x0) {
    if (cmSystemTools::s_FatalErrorOccured == false) {
      bVar1 = cmSystemTools::GetInterruptFlag();
      if (!bVar1) {
        iVar2 = std::__cxx11::string::compare((char *)prop);
        if (iVar2 == 0) {
          pcVar3 = cmGeneratorTarget::GetSourcesProperty(tgt);
          return pcVar3;
        }
      }
    }
    pcVar3 = (char *)0x0;
  }
  return pcVar3;
}

Assistant:

static const char* GetProperty(Target const* tgt, const std::string& prop,
                                 cmMessenger* messenger,
                                 cmListFileBacktrace const& context)
  {
    if (const char* loc = GetLocation(tgt, prop, messenger, context)) {
      return loc;
    }
    if (cmSystemTools::GetFatalErrorOccured()) {
      return CM_NULLPTR;
    }
    if (prop == "SOURCES") {
      return GetSources(tgt, messenger, context);
    }
    return CM_NULLPTR;
  }